

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_syms.c
# Opt level: O3

_Bool gen_iosym(int K,int T,int n_ESIs,uint32_t *ESIs)

{
  uint uVar1;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  size_t sVar2;
  void *__ptr_02;
  undefined8 uVar3;
  undefined4 in_register_0000003c;
  char *pcVar4;
  _Bool _Var5;
  ulong uVar6;
  size_t sVar7;
  size_t prog_sz;
  size_t inter_sym_num;
  size_t work_sz;
  size_t local_48;
  long local_40;
  size_t local_38;
  
  uVar1 = RqInterGetMemSizes(CONCAT44(in_register_0000003c,K),0,0,0,&local_40);
  if (uVar1 == 0) {
    uVar1 = RqOutGetMemSizes(n_ESIs,&local_38,&local_48);
    if (uVar1 == 0) {
      __ptr = malloc(local_38);
      __ptr_00 = malloc(local_48);
      uVar1 = RqOutInit(K,__ptr,local_38);
      if (uVar1 == 0) {
        if (0 < n_ESIs) {
          uVar6 = 0;
          do {
            uVar1 = RqOutAddIds(__ptr,ESIs[uVar6],1);
            if (uVar1 != 0) {
              pcVar4 = "RqOutAddIds(wrk, ESIs[i], 1)";
              uVar3 = 0x84;
              goto LAB_00101926;
            }
            uVar6 = uVar6 + 1;
          } while ((uint)n_ESIs != uVar6);
        }
        uVar1 = RqOutCompile(__ptr,__ptr_00,local_48);
        if (uVar1 == 0) {
          sVar7 = local_40 * T;
          __ptr_01 = malloc(sVar7);
          sVar2 = fread(__ptr_01,1,sVar7,_stdin);
          if (sVar2 == sVar7) {
            sVar2 = (size_t)(n_ESIs * T);
            __ptr_02 = malloc(sVar2);
            uVar1 = RqOutExecute(__ptr_00,(long)T,__ptr_01,__ptr_02,sVar2);
            if (uVar1 == 0) {
              sVar7 = fwrite(__ptr_02,1,sVar2,_stdout);
              _Var5 = true;
              if (sVar7 != sVar2) {
                gen_iosym_cold_2();
                _Var5 = false;
              }
            }
            else {
              _Var5 = false;
              fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                      ,0x93,"RqOutExecute(prog, T, indata, outdata, outdata_sz)",(ulong)uVar1);
            }
            if (__ptr_02 != (void *)0x0) {
              free(__ptr_02);
            }
          }
          else {
            gen_iosym_cold_1();
            _Var5 = false;
          }
          if (__ptr_01 != (void *)0x0) {
            free(__ptr_01);
          }
        }
        else {
          _Var5 = false;
          fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                  ,0x85,"RqOutCompile(wrk, prog, prog_sz)",(ulong)uVar1);
        }
      }
      else {
        pcVar4 = "RqOutInit(K, wrk, work_sz)";
        uVar3 = 0x82;
LAB_00101926:
        _Var5 = false;
        fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                ,uVar3,pcVar4,(ulong)uVar1);
      }
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
      }
      if (__ptr == (void *)0x0) {
        return _Var5;
      }
      free(__ptr);
      return _Var5;
    }
    pcVar4 = "RqOutGetMemSizes(n_ESIs, &work_sz, &prog_sz)";
    uVar3 = 0x7e;
  }
  else {
    pcVar4 = "RqInterGetMemSizes(K, 0, ((void*)0), ((void*)0), &inter_sym_num)";
    uVar3 = 0x7b;
  }
  fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
          ,uVar3,pcVar4,(ulong)uVar1);
  return false;
}

Assistant:

bool gen_iosym(int K, int T, int n_ESIs, uint32_t* ESIs)
{
	bool success = false;

	RqOutWorkMem* wrk = NULL;
	RqOutProgram* prog = NULL;
	void* indata = NULL;
	void* outdata = NULL;

	size_t work_sz, prog_sz, inter_sym_num;
	RUN_NOFAIL(RqInterGetMemSizes(K, 0, NULL, NULL, &inter_sym_num), xit);
	RUN_NOFAIL(RqOutGetMemSizes(n_ESIs,
				&work_sz,
				&prog_sz), xit);
	wrk = malloc(work_sz);
	prog = malloc(prog_sz);

	RUN_NOFAIL(RqOutInit(K, wrk, work_sz), xit);
	for (int i = 0; i < n_ESIs; ++i)
		RUN_NOFAIL(RqOutAddIds(wrk, ESIs[i], 1), xit);
	RUN_NOFAIL(RqOutCompile(wrk, prog, prog_sz), xit);

	/* Read source data */
	size_t indata_sz = T * (size_t)inter_sym_num;
	indata = malloc(indata_sz);
	size_t ret = fread(indata, 1, indata_sz, stdin);
	if (ret != indata_sz) {
		fprintf(stderr, "Error:  fread() returned a short count.\n");
		goto xit;
	}

	/* Generate iblock data */
	size_t outdata_sz = T * n_ESIs;
	outdata = malloc(outdata_sz);
	RUN_NOFAIL(RqOutExecute(prog, T, indata, outdata, outdata_sz), xit);

	/* Print them to stdout */
	size_t out_written = fwrite(outdata, 1, outdata_sz, stdout);
	if (out_written != outdata_sz) {
		fprintf(stderr, "Error:  fwrite() returned a short count.\n");
		goto xit;
	}

	success = true;
xit:
	if (outdata)		free(outdata);
	if (indata)		free(indata);
	if (prog)		free(prog);
	if (wrk)		free(wrk);
	return success;
}